

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_decoder.cpp
# Opt level: O0

idx_t __thiscall
duckdb::DictionaryDecoder::Read
          (DictionaryDecoder *this,uint8_t *defines,idx_t read_count,Vector *result,
          idx_t result_offset)

{
  bool bVar1;
  runtime_error *prVar2;
  idx_t iVar3;
  sel_t *psVar4;
  type pVVar5;
  Vector *in_RCX;
  ulong in_RDX;
  string *in_RDI;
  ulong in_R8;
  idx_t idx;
  uint32_t max_index;
  idx_t valid_count;
  unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>,_true>
  *in_stack_ffffffffffffff50;
  uint64_t in_stack_ffffffffffffff60;
  uint32_t uVar6;
  Allocator *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  uint8_t *in_stack_ffffffffffffff78;
  DictionaryDecoder *in_stack_ffffffffffffff80;
  DictionaryDecoder *in_stack_ffffffffffffff90;
  idx_t local_50;
  uint local_44;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_> *)0x850575);
  if (!bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"Parquet file is likely corrupted, missing dictionary")
    ;
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar3 = GetValidValues(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                         CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                         (idx_t)in_stack_ffffffffffffff68);
  if (iVar3 == in_RDX) {
    unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>,_true>::operator->
              (in_stack_ffffffffffffff50);
    uVar6 = (uint32_t)(in_stack_ffffffffffffff60 >> 0x20);
    psVar4 = SelectionVector::data((SelectionVector *)(in_RDI + 0x30));
    data_ptr_cast<unsigned_int>(psVar4);
    RleBpDecoder::GetBatch<unsigned_int>
              ((RleBpDecoder *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (data_ptr_t)in_stack_ffffffffffffff68,uVar6);
    local_44 = 0;
    for (local_50 = 0; local_50 < iVar3; local_50 = local_50 + 1) {
      psVar4 = SelectionVector::operator[]((SelectionVector *)(in_RDI + 0x30),local_50);
      local_44 = MaxValue<unsigned_int>(local_44,*psVar4);
    }
    if (*(ulong *)(in_RDI + 0x48) <= (ulong)local_44) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar2,"Parquet file is likely corrupted, dictionary offset out of range");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else if (iVar3 != 0) {
    ResizeableBuffer::resize
              ((ResizeableBuffer *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    uVar6 = (uint32_t)(in_stack_ffffffffffffff60 >> 0x20);
    unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>,_true>::operator->
              (in_stack_ffffffffffffff50);
    RleBpDecoder::GetBatch<unsigned_int>
              ((RleBpDecoder *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (data_ptr_t)in_stack_ffffffffffffff68,uVar6);
    ConvertDictToSelVec(in_stack_ffffffffffffff90,(uint32_t *)in_RDI,
                        (SelectionVector *)in_stack_ffffffffffffff80,
                        (idx_t)in_stack_ffffffffffffff78);
  }
  if (in_R8 == 0) {
    pVVar5 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                        in_RCX);
    duckdb::Vector::Dictionary
              (in_RCX,(ulong)pVVar5,
               (SelectionVector *)(*(long *)(in_RDI + 0x48) + (ulong)((byte)in_RDI[0x68] & 1)),
               (ulong)(in_RDI + 0x30));
    std::__cxx11::string::string((string *)&stack0xffffffffffffff90,(string *)(in_RDI + 0x70));
    DictionaryVector::SetDictionaryId((Vector *)in_stack_ffffffffffffff90,in_RDI);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  }
  else {
    pVVar5 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                        in_stack_ffffffffffffff50);
    duckdb::VectorOperations::Copy(pVVar5,in_RCX,(SelectionVector *)(in_RDI + 0x30),in_RDX,0,in_R8);
  }
  return iVar3;
}

Assistant:

idx_t DictionaryDecoder::Read(uint8_t *defines, idx_t read_count, Vector &result, idx_t result_offset) {
	if (!dictionary || dictionary_size < 0) {
		throw std::runtime_error("Parquet file is likely corrupted, missing dictionary");
	}
	idx_t valid_count = GetValidValues(defines, read_count, result_offset);
	if (valid_count == read_count) {
		// all values are valid - we can directly decompress the offsets into the selection vector
		dict_decoder->GetBatch<uint32_t>(data_ptr_cast(dictionary_selection_vector.data()), valid_count);
		// we do still need to verify the offsets though
		uint32_t max_index = 0;
		for (idx_t idx = 0; idx < valid_count; idx++) {
			max_index = MaxValue(max_index, dictionary_selection_vector[idx]);
		}
		if (max_index >= dictionary_size) {
			throw std::runtime_error("Parquet file is likely corrupted, dictionary offset out of range");
		}
	} else if (valid_count > 0) {
		// for the valid entries - decode the offsets
		offset_buffer.resize(reader.reader.allocator, sizeof(uint32_t) * valid_count);
		dict_decoder->GetBatch<uint32_t>(offset_buffer.ptr, valid_count);
		ConvertDictToSelVec(reinterpret_cast<uint32_t *>(offset_buffer.ptr), valid_sel, valid_count);
	}
#ifdef DEBUG
	dictionary_selection_vector.Verify(read_count, dictionary_size + can_have_nulls);
#endif
	if (result_offset == 0) {
		result.Dictionary(*dictionary, dictionary_size + can_have_nulls, dictionary_selection_vector, read_count);
		DictionaryVector::SetDictionaryId(result, dictionary_id);
		D_ASSERT(result.GetVectorType() == VectorType::DICTIONARY_VECTOR);
	} else {
		D_ASSERT(result.GetVectorType() == VectorType::FLAT_VECTOR);
		VectorOperations::Copy(*dictionary, result, dictionary_selection_vector, read_count, 0, result_offset);
	}
	return valid_count;
}